

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

maybe<pstore::uuid,_void> *
pstore::uuid::from_string(maybe<pstore::uuid,_void> *__return_storage_ptr__,string *str)

{
  bool bVar1;
  long lVar2;
  iterator out_00;
  reference pcVar3;
  hex_decoder<unsigned_char_*> hVar4;
  uuid local_79;
  char local_69;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  char digit;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  uint count;
  undefined1 local_38 [8];
  hex_decoder<unsigned_char_*> out;
  container_type data;
  string *str_local;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0x24) {
    out_00 = std::begin<std::array<unsigned_char,16ul>>((array<unsigned_char,_16UL> *)&out.is_high_)
    ;
    hVar4 = (anonymous_namespace)::make_hex_decoder<unsigned_char*>(out_00);
    local_38 = (undefined1  [8])hVar4.out_;
    out.out_._0_1_ = hVar4.is_high_;
    __range1._4_4_ = 0;
    __end1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_68._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff98), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      local_69 = *pcVar3;
      if ((((__range1._4_4_ == 8) || (__range1._4_4_ == 0xd)) || (__range1._4_4_ == 0x12)) ||
         (__range1._4_4_ == 0x17)) {
        if (local_69 != '-') {
          nothing<pstore::uuid>();
          return __return_storage_ptr__;
        }
        bVar1 = anon_unknown.dwarf_24db22::hex_decoder<unsigned_char_*>::is_high
                          ((hex_decoder<unsigned_char_*> *)local_38);
        if (!bVar1) {
          assert_failed("out.is_high ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                        ,0x9b);
        }
      }
      else if ((local_69 < 'a') || ('f' < local_69)) {
        if ((local_69 < 'A') || ('F' < local_69)) {
          if ((local_69 < '0') || ('9' < local_69)) {
            nothing<pstore::uuid>();
            return __return_storage_ptr__;
          }
          anon_unknown.dwarf_24db22::hex_decoder<unsigned_char_*>::append
                    ((hex_decoder<unsigned_char_*> *)local_38,(int)local_69 - 0x30);
        }
        else {
          anon_unknown.dwarf_24db22::hex_decoder<unsigned_char_*>::append
                    ((hex_decoder<unsigned_char_*> *)local_38,(int)local_69 - 0x37);
        }
      }
      else {
        anon_unknown.dwarf_24db22::hex_decoder<unsigned_char_*>::append
                  ((hex_decoder<unsigned_char_*> *)local_38,(int)local_69 - 0x57);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    uuid(&local_79,(container_type *)&out.is_high_);
    just<pstore::uuid>(__return_storage_ptr__,&local_79);
  }
  else {
    nothing<pstore::uuid>();
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<uuid> uuid::from_string (std::string const & str) {
        if (str.length () != string_length) {
            return nothing<uuid> ();
        }

        container_type data;
        auto out = make_hex_decoder (std::begin (data));
        auto count = 0U;
        for (auto const digit : str) {
            switch (count++) {
            case 8:
            case 13:
            case 18:
            case 23:
                if (digit != '-') {
                    return nothing<uuid> ();
                }
                PSTORE_ASSERT (out.is_high ());
                break;
            default:
                if (digit >= 'a' && digit <= 'f') {
                    out.append (static_cast<unsigned> (digit) - ('a' - 10));
                } else if (digit >= 'A' && digit <= 'F') {
                    out.append (static_cast<unsigned> (digit) - ('A' - 10));
                } else if (digit >= '0' && digit <= '9') {
                    out.append (static_cast<unsigned> (digit) - '0');
                } else {
                    return nothing<uuid> ();
                }
                break;
            }
        }

        return just (uuid{data});
    }